

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SGXMLScanner::scanRawAttrListforNameSpaces(SGXMLScanner *this,XMLSize_t attCount)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  ushort uVar5;
  XMLValidator *pXVar6;
  undefined2 *puVar7;
  SchemaValidator *pSVar8;
  XMLBufferMgr *pXVar9;
  undefined1 uVar10;
  int iVar11;
  uint uVar12;
  KVStringPair *pKVar13;
  XMLCh *pXVar14;
  XMLCh *pXVar15;
  ReaderMgr *this_00;
  XMLBuffer *pXVar16;
  ulong uVar17;
  undefined8 *puVar18;
  XMLCh *pXVar19;
  XMLCh *pXVar20;
  long lVar21;
  ushort *puVar22;
  XMLSize_t index;
  DatatypeValidator *pDVar23;
  XMLSize_t XVar24;
  XMLSize_t XVar25;
  int colonPos;
  XMLBufBid bbXsi;
  int local_84;
  XMLBufferMgr *local_80;
  XMLSize_t local_78;
  uint local_6c;
  XMLBuffer *local_68;
  XMLBufferMgr *local_60;
  XMLBuffer *local_58;
  long local_50;
  XMLCh *local_48;
  XMLCh *local_40;
  XMLBuffer *local_38;
  
  local_78 = attCount;
  if (attCount == 0) {
    if (this->fSeeXsi == false) {
      return;
    }
  }
  else {
    XVar24 = 0;
    do {
      pKVar13 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar24);
      pXVar15 = pKVar13->fKey;
      iVar11 = XMLString::compareNString(pXVar15,L"xmlns:",6);
      if ((pXVar15 == L"xmlns") || (iVar11 == 0)) {
LAB_002b03d3:
        pXVar14 = pKVar13->fValue;
        updateNSMap(this,pXVar15,pXVar14,this->fRawAttrColonList[XVar24]);
        if (pXVar14 == L"http://www.w3.org/2001/XMLSchema-instance") {
LAB_002b0421:
          this->fSeeXsi = true;
        }
        else {
          pXVar15 = L"http://www.w3.org/2001/XMLSchema-instance";
          if (pXVar14 == (XMLCh *)0x0) {
LAB_002b041b:
            if (*pXVar15 == L'\0') goto LAB_002b0421;
          }
          else {
            pXVar15 = L"http://www.w3.org/2001/XMLSchema-instance";
            do {
              XVar3 = *pXVar14;
              if (XVar3 == L'\0') goto LAB_002b041b;
              pXVar14 = pXVar14 + 1;
              XVar4 = *pXVar15;
              pXVar15 = pXVar15 + 1;
            } while (XVar3 == XVar4);
          }
        }
      }
      else {
        pXVar14 = L"xmlns";
        if (pXVar15 == (XMLCh *)0x0) {
LAB_002b03cd:
          if (*pXVar14 == L'\0') goto LAB_002b03d3;
        }
        else {
          pXVar14 = L"xmlns";
          pXVar19 = pXVar15;
          do {
            XVar3 = *pXVar19;
            if (XVar3 == L'\0') goto LAB_002b03cd;
            pXVar19 = pXVar19 + 1;
            XVar4 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar3 == XVar4);
        }
      }
      XVar24 = XVar24 + 1;
    } while (XVar24 != local_78);
    if (this->fSeeXsi == false) {
      return;
    }
    XVar24 = 0;
    do {
      pKVar13 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar24);
      pXVar15 = pKVar13->fKey;
      XVar25 = (XMLSize_t)this->fRawAttrColonList[XVar24];
      pXVar14 = L"";
      if (XVar25 != 0xffffffffffffffff) {
        (this->super_XMLScanner).fURIBuf.fIndex = 0;
        XMLBuffer::append(&(this->super_XMLScanner).fURIBuf,pXVar15,XVar25);
        pXVar14 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar14[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar12 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar14,Mode_Attribute);
      if (uVar12 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar15 = pXVar15 + XVar25 + 1;
        if (pXVar15 == L"schemaLocation") {
LAB_002b0544:
          parseSchemaLocation(this,pKVar13->fValue,false);
        }
        else {
          pXVar14 = L"schemaLocation";
          if (pXVar15 == (XMLCh *)0x0) {
LAB_002b0508:
            if (*pXVar14 == L'\0') goto LAB_002b0544;
          }
          else {
            pXVar14 = L"schemaLocation";
            pXVar19 = pXVar15;
            do {
              XVar3 = *pXVar19;
              if (XVar3 == L'\0') goto LAB_002b0508;
              pXVar19 = pXVar19 + 1;
              XVar4 = *pXVar14;
              pXVar14 = pXVar14 + 1;
            } while (XVar3 == XVar4);
          }
          if (pXVar15 == L"noNamespaceSchemaLocation") {
LAB_002b0556:
            resolveSchemaGrammar(this,pKVar13->fValue,L"",false);
          }
          else {
            pXVar14 = L"noNamespaceSchemaLocation";
            if (pXVar15 == (XMLCh *)0x0) {
LAB_002b0550:
              if (*pXVar14 == L'\0') goto LAB_002b0556;
            }
            else {
              pXVar14 = L"noNamespaceSchemaLocation";
              do {
                XVar3 = *pXVar15;
                if (XVar3 == L'\0') goto LAB_002b0550;
                pXVar15 = pXVar15 + 1;
                XVar4 = *pXVar14;
                pXVar14 = pXVar14 + 1;
              } while (XVar3 == XVar4);
            }
          }
        }
      }
      XVar24 = XVar24 + 1;
    } while (XVar24 != local_78);
  }
  pXVar6 = (this->super_XMLScanner).fValidator;
  if ((pXVar6 != (XMLValidator *)0x0) &&
     (iVar11 = (*pXVar6->_vptr_XMLValidator[0xd])(), local_78 != 0 && (char)iVar11 == '\x01')) {
    local_38 = &(this->super_XMLScanner).fURIBuf;
    local_80 = &(this->super_XMLScanner).fBufMgr;
    local_58 = &(this->super_XMLScanner).fPrefixBuf;
    XVar24 = 0;
    do {
      pKVar13 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar24);
      pXVar15 = pKVar13->fKey;
      XVar25 = (XMLSize_t)this->fRawAttrColonList[XVar24];
      pXVar14 = L"";
      if (XVar25 != 0xffffffffffffffff) {
        (this->super_XMLScanner).fURIBuf.fIndex = 0;
        XMLBuffer::append(local_38,pXVar15,XVar25);
        pXVar14 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar14[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar12 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar14,Mode_Attribute);
      pXVar9 = local_80;
      if (uVar12 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar14 = pKVar13->fValue;
        pXVar15 = pXVar15 + XVar25 + 1;
        if (pXVar15 == L"type") {
LAB_002b06d8:
          pXVar16 = XMLBufferMgr::bidOnBuffer(local_80);
          local_60 = pXVar9;
          uVar17 = 0x51;
          uVar5 = 0x4e;
          puVar22 = &DAT_00368cac;
          do {
            uVar17 = (ulong)uVar5 + (uVar17 >> 0x18) + uVar17 * 0x26;
            uVar5 = *puVar22;
            puVar22 = puVar22 + 1;
          } while (uVar5 != 0);
          for (puVar18 = *(undefined8 **)
                          (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                          (uVar17 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18)) *
                          8); puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)puVar18[1]) {
            puVar7 = (undefined2 *)puVar18[2];
            if (puVar7 == &SchemaSymbols::fgDT_QNAME) {
LAB_002b0791:
              pDVar23 = (DatatypeValidator *)*puVar18;
              goto LAB_002b0794;
            }
            if (puVar7 != (undefined2 *)0x0) {
              lVar21 = 0;
              do {
                psVar1 = (short *)((long)&SchemaSymbols::fgDT_QNAME + lVar21);
                if (*psVar1 == 0) {
                  if (*(short *)((long)puVar7 + lVar21) == 0) goto LAB_002b0791;
                  break;
                }
                psVar2 = (short *)((long)puVar7 + lVar21);
                lVar21 = lVar21 + 2;
              } while (*psVar1 == *psVar2);
            }
          }
          pDVar23 = (DatatypeValidator *)0x0;
LAB_002b0794:
          local_68 = pXVar16;
          normalizeAttRawValue(this,L"type",pXVar14,pXVar16);
          pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
          pXVar15 = pXVar16->fBuffer;
          pXVar15[pXVar16->fIndex] = L'\0';
          SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar23,pXVar15,pXVar16,true);
          if (pXVar16->fIndex != 0) {
            local_84 = -1;
            pXVar15 = pXVar16->fBuffer;
            pXVar15[pXVar16->fIndex] = L'\0';
            local_6c = XMLScanner::resolveQName
                                 (&this->super_XMLScanner,pXVar15,local_58,Mode_Element,&local_84);
            pXVar6 = (this->super_XMLScanner).fValidator;
            local_40 = (this->super_XMLScanner).fPrefixBuf.fBuffer;
            local_40[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
            local_48 = pXVar16->fBuffer;
            local_48[pXVar16->fIndex] = L'\0';
            local_50 = (long)local_84;
            if (pXVar6[1].fReaderMgr != (ReaderMgr *)0x0) {
              (*((pXVar6[1].fReaderMgr)->super_Locator)._vptr_Locator[1])();
            }
            this_00 = (ReaderMgr *)
                      XMemory::operator_new(0x48,(MemoryManager *)pXVar6[1]._vptr_XMLValidator);
            QName::QName((QName *)this_00,local_40,local_48 + local_50 + 1,local_6c,
                         (MemoryManager *)pXVar6[1]._vptr_XMLValidator);
            pXVar6[1].fReaderMgr = this_00;
          }
          XMLBufferMgr::releaseBuffer(local_80,pXVar16);
        }
        else {
          pXVar19 = L"type";
          if (pXVar15 == (XMLCh *)0x0) {
LAB_002b068d:
            if (*pXVar19 == L'\0') goto LAB_002b06d8;
          }
          else {
            pXVar19 = L"type";
            pXVar20 = pXVar15;
            do {
              XVar3 = *pXVar20;
              if (XVar3 == L'\0') goto LAB_002b068d;
              pXVar20 = pXVar20 + 1;
              XVar4 = *pXVar19;
              pXVar19 = pXVar19 + 1;
            } while (XVar3 == XVar4);
          }
          if (pXVar15 == L"nil") {
LAB_002b08b6:
            pXVar16 = XMLBufferMgr::bidOnBuffer(local_80);
            local_60 = pXVar9;
            uVar17 = 0x62;
            uVar5 = 0x6f;
            puVar22 = &DAT_00368a34;
            do {
              uVar17 = (ulong)uVar5 + (uVar17 >> 0x18) + uVar17 * 0x26;
              uVar5 = *puVar22;
              puVar22 = puVar22 + 1;
            } while (uVar5 != 0);
            for (puVar18 = *(undefined8 **)
                            (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                            (uVar17 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18))
                            * 8); puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)puVar18[1])
            {
              puVar7 = (undefined2 *)puVar18[2];
              if (puVar7 == &SchemaSymbols::fgDT_BOOLEAN) {
LAB_002b0977:
                pDVar23 = (DatatypeValidator *)*puVar18;
                goto LAB_002b097a;
              }
              if (puVar7 != (undefined2 *)0x0) {
                lVar21 = 0;
                do {
                  psVar1 = (short *)((long)&SchemaSymbols::fgDT_BOOLEAN + lVar21);
                  if (*psVar1 == 0) {
                    if (*(short *)((long)puVar7 + lVar21) == 0) goto LAB_002b0977;
                    break;
                  }
                  psVar2 = (short *)((long)puVar7 + lVar21);
                  lVar21 = lVar21 + 2;
                } while (*psVar1 == *psVar2);
              }
            }
            pDVar23 = (DatatypeValidator *)0x0;
LAB_002b097a:
            local_68 = pXVar16;
            normalizeAttRawValue(this,L"nil",pXVar14,pXVar16);
            pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
            pXVar15 = pXVar16->fBuffer;
            pXVar15[pXVar16->fIndex] = L'\0';
            SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar23,pXVar15,pXVar16,true);
            pXVar15 = pXVar16->fBuffer;
            pXVar15[pXVar16->fIndex] = L'\0';
            uVar10 = 1;
            pXVar19 = L"true";
            if (pXVar15 == L"true") {
LAB_002b0a59:
              pXVar6 = (this->super_XMLScanner).fValidator;
              *(undefined1 *)&pXVar6[1].fScanner = uVar10;
              *(undefined1 *)((long)&pXVar6[1].fScanner + 1) = 1;
            }
            else {
              if (pXVar15 == (XMLCh *)0x0) {
LAB_002b09fe:
                if (*pXVar19 == L'\0') goto LAB_002b0a59;
              }
              else {
                pXVar19 = L"true";
                pXVar20 = pXVar15;
                do {
                  XVar3 = *pXVar20;
                  if (XVar3 == L'\0') goto LAB_002b09fe;
                  pXVar20 = pXVar20 + 1;
                  XVar4 = *pXVar19;
                  pXVar19 = pXVar19 + 1;
                } while (XVar3 == XVar4);
              }
              pXVar19 = L"false";
              if (pXVar15 == L"false") {
LAB_002b0a57:
                uVar10 = 0;
                goto LAB_002b0a59;
              }
              if (pXVar15 == (XMLCh *)0x0) {
LAB_002b0a39:
                if (*pXVar19 == L'\0') goto LAB_002b0a57;
              }
              else {
                pXVar19 = L"false";
                pXVar20 = pXVar15;
                do {
                  XVar3 = *pXVar20;
                  if (XVar3 == L'\0') goto LAB_002b0a39;
                  pXVar20 = pXVar20 + 1;
                  XVar4 = *pXVar19;
                  pXVar19 = pXVar19 + 1;
                } while (XVar3 == XVar4);
              }
              XMLScanner::emitError
                        (&this->super_XMLScanner,InvalidAttValue,pXVar15,pXVar14,(XMLCh *)0x0,
                         (XMLCh *)0x0);
            }
            XMLBufferMgr::releaseBuffer(local_80,pXVar16);
          }
          else {
            pXVar19 = L"nil";
            if (pXVar15 == (XMLCh *)0x0) {
LAB_002b08ac:
              if (*pXVar19 == L'\0') goto LAB_002b08b6;
            }
            else {
              pXVar19 = L"nil";
              do {
                XVar3 = *pXVar15;
                if (XVar3 == L'\0') goto LAB_002b08ac;
                pXVar15 = pXVar15 + 1;
                XVar4 = *pXVar19;
                pXVar19 = pXVar19 + 1;
              } while (XVar3 == XVar4);
            }
          }
        }
      }
      XVar24 = XVar24 + 1;
    } while (XVar24 != local_78);
  }
  return;
}

Assistant:

void SGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr;

            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {
                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }
            else {
                prefPtr = XMLUni::fgZeroLenString;
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        if (fValidator && fValidator->handlesSchema())
        {
            for (XMLSize_t index = 0; index < attCount; index++)
            {
                // each attribute has the prefix:suffix="value"
                const KVStringPair* curPair = fRawAttrList->elementAt(index);
                const XMLCh* rawPtr = curPair->getKey();
                const XMLCh* prefPtr;

                int   colonInd = fRawAttrColonList[index];

                if (colonInd != -1) {
                    fURIBuf.set(rawPtr, colonInd);
                    prefPtr = fURIBuf.getRawBuffer();
                }
                else {
                    prefPtr = XMLUni::fgZeroLenString;
                }

                // scan for schema type
                if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                    const XMLCh* valuePtr = curPair->getValue();
                    const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                    if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                    {
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiType = bbXsi.getBuffer();

                        // normalize the attribute according to schema whitespace facet
                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                        normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                        if (!fXsiType.isEmpty()) {
                            int colonPos = -1;
                            unsigned int uriId = resolveQName (
                                  fXsiType.getRawBuffer()
                                , fPrefixBuf
                                , ElemStack::Mode_Element
                                , colonPos
                            );
                            ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                        }
                    }
                    else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                    {
                        // normalize the attribute according to schema whitespace facet
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiNil = bbXsi.getBuffer();

                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                        normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                        if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                            ((SchemaValidator*)fValidator)->setNillable(true);
                        else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                            ((SchemaValidator*)fValidator)->setNillable(false);
                        else
                            emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                    }
                }
            }
        }
    }
}